

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  double dVar3;
  string local_6f0;
  string local_6d0;
  Price price;
  OrderQty orderQty;
  OrdType ordType;
  undefined1 local_5a8 [16];
  _Alloc_hider local_598;
  char local_588 [16];
  _Alloc_hider local_578;
  size_type local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  field_metrics local_558;
  undefined1 local_550 [16];
  _Alloc_hider local_540;
  char local_530 [16];
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  field_metrics local_500;
  Account account;
  ClOrdID clOrdID;
  Side side;
  FieldBase local_3f0;
  FieldBase local_398;
  FieldBase local_340;
  Symbol symbol;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport executionReport;
  
  FIX::StringField::StringField(&symbol.super_StringField,0x37);
  symbol.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001484d8;
  FIX::CharField::CharField(&side.super_CharField,0x36);
  side.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148510;
  FIX::CharField::CharField(&ordType.super_CharField,0x28);
  ordType.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148580;
  FIX::DoubleField::DoubleField(&orderQty.super_QtyField,0x26);
  orderQty.super_QtyField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001485b8;
  FIX::DoubleField::DoubleField(&price.super_PriceField,0x2c);
  price.super_PriceField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148628;
  FIX::StringField::StringField(&clOrdID.super_StringField,0xb);
  clOrdID.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148660
  ;
  FIX::StringField::StringField(&account.super_StringField,1);
  account.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148698
  ;
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_6d0,this);
    local_550._0_8_ = &PTR__FieldBase_00148480;
    local_550._8_4_ = 0x25;
    local_540._M_p = local_530;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_540,local_6d0._M_dataplus._M_p,
               local_6d0._M_dataplus._M_p + local_6d0._M_string_length);
    local_520._M_p = (pointer)&local_510;
    local_518 = 0;
    local_510._M_local_buf[0] = '\0';
    local_500.m_length = 0;
    local_500.m_checksum = 0;
    local_550._0_8_ = &PTR__FieldBase_00148778;
    genExecID_abi_cxx11_(&local_6f0,this);
    local_5a8._0_8_ = &PTR__FieldBase_00148480;
    local_5a8._8_4_ = 0x11;
    local_598._M_p = local_588;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_598,local_6f0._M_dataplus._M_p,
               local_6f0._M_dataplus._M_p + local_6f0._M_string_length);
    local_578._M_p = (pointer)&local_568;
    local_570 = 0;
    local_568._M_local_buf[0] = '\0';
    local_558.m_length = 0;
    local_558.m_checksum = 0;
    local_5a8._0_8_ = &PTR__FieldBase_001487b0;
    FIX::CharField::CharField((CharField *)&local_340,0x14,'0');
    local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001487e8;
    FIX::CharField::CharField((CharField *)&local_398,0x27,'2');
    local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148820;
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_3f0,0x20,dVar3,0);
    local_3f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148858;
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_1e0,0x1f,dVar3,0);
    local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148890;
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_238,0xe,dVar3,0);
    local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001488c8;
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_290,6,dVar3,0);
    local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148900;
    FIX40::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)local_550,(ExecID *)local_5a8,(ExecTransType *)&local_340
               ,(OrdStatus *)&local_398,&symbol,&side,(OrderQty *)&orderQty.super_QtyField,
               (LastShares *)&local_3f0,(LastPx *)&local_1e0,(CumQty *)&local_238,
               (AvgPx *)&local_290);
    FIX::FieldBase::~FieldBase(&local_290);
    FIX::FieldBase::~FieldBase(&local_238);
    FIX::FieldBase::~FieldBase(&local_1e0);
    FIX::FieldBase::~FieldBase(&local_3f0);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase(&local_340);
    FIX::FieldBase::~FieldBase((FieldBase *)local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
      operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldBase::~FieldBase((FieldBase *)local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)&clOrdID,true);
    _Var2 = FIX::FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      ((FieldMap *)message,*(FieldBase **)(message + 8),
                       *(FieldBase **)(message + 0x10),
                       account.super_StringField.super_FieldBase.m_tag);
    if (_Var2._M_current != *(FieldBase **)(message + 0x10)) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  executionReport.super_Message._0_8_ = &executionReport.super_Message.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&executionReport,"");
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX40::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX40::ExecutionReport executionReport = FIX40::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      symbol,
      side,
      orderQty,
      FIX::LastShares(orderQty),
      FIX::LastPx(price),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}